

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O2

int __thiscall GPIOClass::export_gpio(GPIOClass *this)

{
  ostream *poVar1;
  int iVar2;
  string export_str;
  ofstream exportgpio;
  byte abStack_1f0 [480];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&export_str,"/sys/class/gpio/export",(allocator<char> *)&exportgpio);
  std::ofstream::ofstream(&exportgpio,export_str._M_dataplus._M_p,_S_out);
  if ((abStack_1f0[*(long *)(_exportgpio + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&exportgpio,(string *)this);
    iVar2 = 0;
    std::ofstream::close();
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout," OPERATION FAILED: Unable to export GPIO");
    poVar1 = std::operator<<(poVar1,(string *)this);
    poVar1 = std::operator<<(poVar1," .");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = -1;
  }
  std::ofstream::~ofstream(&exportgpio);
  std::__cxx11::string::~string((string *)&export_str);
  return iVar2;
}

Assistant:

int GPIOClass::export_gpio()
{
    string export_str = "/sys/class/gpio/export";
    ofstream exportgpio(export_str.c_str()); // Open "export" file. Convert C++ string to C string. Required for all Linux pathnames
    if (!exportgpio){
        cout << " OPERATION FAILED: Unable to export GPIO"<< this->gpionum <<" ."<< endl;
        return -1;
    }

    exportgpio << this->gpionum ; //write GPIO number to export
    exportgpio.close(); //close export file
    return 0;
}